

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

bool absl::GenericCompare<bool,absl::Cord>(Cord *lhs,Cord *rhs,size_t size_to_compare)

{
  int iVar1;
  ulong uVar2;
  string_view sVar3;
  string_view sVar4;
  
  uVar2 = (ulong)(lhs->contents_).data_.rep_.field_0.data[0];
  if ((uVar2 & 1) == 0) {
    uVar2 = uVar2 >> 1;
  }
  else {
    uVar2 = ((lhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar2 == 0) {
    sVar3 = (string_view)ZEXT816(0);
  }
  else {
    sVar3 = Cord::InlineRep::FindFlatStartPiece(&lhs->contents_);
  }
  uVar2 = (ulong)(rhs->contents_).data_.rep_.field_0.data[0];
  if ((uVar2 & 1) == 0) {
    uVar2 = uVar2 >> 1;
  }
  else {
    uVar2 = ((rhs->contents_).data_.rep_.field_0.as_tree.rep)->length;
  }
  if (uVar2 == 0) {
    sVar4 = (string_view)ZEXT816(0);
  }
  else {
    sVar4 = Cord::InlineRep::FindFlatStartPiece(&rhs->contents_);
  }
  uVar2 = sVar3._M_len;
  if (sVar4._M_len < sVar3._M_len) {
    uVar2 = sVar4._M_len;
  }
  if (uVar2 <= size_to_compare) {
    if (uVar2 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = memcmp(sVar3._M_str,sVar4._M_str,uVar2);
    }
    if (iVar1 == 0 && uVar2 != size_to_compare) {
      iVar1 = Cord::CompareSlowPath(lhs,rhs,uVar2,size_to_compare);
    }
    return iVar1 == 0;
  }
  __assert_fail("size_to_compare >= compared_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/cord.cc"
                ,0x3d1,
                "ResultType absl::GenericCompare(const Cord &, const RHS &, size_t) [ResultType = bool, RHS = absl::Cord]"
               );
}

Assistant:

ResultType GenericCompare(const Cord& lhs, const RHS& rhs,
                          size_t size_to_compare) {
  absl::string_view lhs_chunk = Cord::GetFirstChunk(lhs);
  absl::string_view rhs_chunk = Cord::GetFirstChunk(rhs);

  size_t compared_size = std::min(lhs_chunk.size(), rhs_chunk.size());
  assert(size_to_compare >= compared_size);
  int memcmp_res = compared_size > 0 ? ::memcmp(lhs_chunk.data(),
                                                rhs_chunk.data(), compared_size)
                                     : 0;
  if (compared_size == size_to_compare || memcmp_res != 0) {
    return ComputeCompareResult<ResultType>(memcmp_res);
  }

  return ComputeCompareResult<ResultType>(
      lhs.CompareSlowPath(rhs, compared_size, size_to_compare));
}